

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O3

ssize_t __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::write(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
        *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_> bVar5;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  char *__last;
  uint uVar9;
  int iVar10;
  char_type buffer [13];
  char local_35 [13];
  
  uVar2 = 0x1f;
  if ((__fd | 1U) != 0) {
    for (; (__fd | 1U) >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  uVar2 = (uVar2 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar9 = (uVar2 - ((uint)__fd <
                   *(uint *)(basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar2 * 4))) + 1;
  bVar5.container = (this->out).container;
  iVar10 = (int)__buf;
  if ((int)uVar9 < iVar10) {
    if ((int)uVar9 < iVar10) {
      iVar10 = (iVar10 - uVar2) +
               (uint)((uint)__fd <
                     *(uint *)(basic_data<void>::ZERO_OR_POWERS_OF_10_32 + (ulong)uVar2 * 4));
      do {
        sVar3 = ((bVar5.container)->super_basic_buffer<char>).size_;
        uVar8 = sVar3 + 1;
        if (((bVar5.container)->super_basic_buffer<char>).capacity_ < uVar8) {
          (**((bVar5.container)->super_basic_buffer<char>)._vptr_basic_buffer)(bVar5.container);
          sVar3 = ((bVar5.container)->super_basic_buffer<char>).size_;
          uVar8 = sVar3 + 1;
        }
        ((bVar5.container)->super_basic_buffer<char>).size_ = uVar8;
        ((bVar5.container)->super_basic_buffer<char>).ptr_[sVar3] = '0';
        iVar10 = iVar10 + -1;
      } while (1 < iVar10);
    }
    (this->out).container = bVar5.container;
  }
  __last = local_35 + uVar9;
  pcVar4 = __last;
  uVar2 = __fd;
  if (99 < (uint)__fd) {
    do {
      __fd = uVar2 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)(basic_data<void>::DIGITS + (ulong)(uVar2 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar2;
      uVar2 = uVar2 / 100;
    } while (bVar1);
  }
  if ((uint)__fd < 10) {
    bVar6 = (byte)__fd | 0x30;
    lVar7 = -1;
  }
  else {
    pcVar4[-1] = basic_data<void>::DIGITS[((ulong)(uint)__fd * 2 & 0xffffffff) + 1];
    bVar6 = basic_data<void>::DIGITS[(ulong)(uint)__fd * 2];
    lVar7 = -2;
  }
  pcVar4[lVar7] = bVar6;
  bVar5 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>>
                    (local_35,__last,bVar5);
  (this->out).container = bVar5.container;
  return (ssize_t)bVar5.container;
}

Assistant:

void write(int value, int width) {
    typedef typename int_traits<int>::main_type main_type;
    main_type n = to_unsigned(value);
    int num_digits = internal::count_digits(n);
    if (width > num_digits)
      out = std::fill_n(out, width - num_digits, '0');
    out = format_decimal<char_type>(out, n, num_digits);
  }